

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGCachePolicyULT.cpp
# Opt level: O3

void __thiscall
CTestXe_LPGCachePolicy::SetUpXe_LPGVariant(CTestXe_LPGCachePolicy *this,PRODUCT_FAMILY platform)

{
  ADAPTER_INFO *pAVar1;
  
  puts("SetUpXe_LPGVariant");
  CommonULT::GfxPlatform.eRenderCoreFamily =
       (0x4f9 < (int)platform) + 0xc07 + (uint)(0x4f9 < (int)platform);
  CommonULT::GfxPlatform.eProductFamily = platform;
  pAVar1 = (ADAPTER_INFO *)calloc(1,0x9bf);
  CommonULT::pGfxAdapterInfo = pAVar1;
  if (pAVar1 == (ADAPTER_INFO *)0x0) {
    return;
  }
  (pAVar1->SkuTable).field_1 = (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)0x1000048002;
  if (platform == IGFX_BMG) {
    (pAVar1->SkuTable).field_1 = (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)0x1200248002;
  }
  else if ((int)platform < 0x4fa) goto LAB_0011ffef;
  *(undefined2 *)&(pAVar1->SkuTable).field_0 = 0x100;
  *(undefined8 *)&(pAVar1->WaTable).field_0x4 = 0x600000000000000;
LAB_0011ffef:
  CommonULT::SetUpTestCase();
  return;
}

Assistant:

void CTestXe_LPGCachePolicy::SetUpXe_LPGVariant(PRODUCT_FAMILY platform)
{
    printf("%s\n", __FUNCTION__);

    GfxPlatform.eProductFamily = platform;

    if (platform == IGFX_LUNARLAKE)
    {
        GfxPlatform.eRenderCoreFamily = IGFX_XE2_LPG_CORE;
    }
    else if (platform >= IGFX_BMG)
    {
        GfxPlatform.eRenderCoreFamily = IGFX_XE2_HPG_CORE;
    }
    else
    {
        GfxPlatform.eRenderCoreFamily = IGFX_XE_HPG_CORE;
    }

    pGfxAdapterInfo = (ADAPTER_INFO *)malloc(sizeof(ADAPTER_INFO));
    if(pGfxAdapterInfo)
    {
        memset(pGfxAdapterInfo, 0, sizeof(ADAPTER_INFO));

        pGfxAdapterInfo->SkuTable.FtrLinearCCS             = 1; //legacy y =>0 - test both
        pGfxAdapterInfo->SkuTable.FtrStandardMipTailFormat = 1;
        pGfxAdapterInfo->SkuTable.FtrTileY                 = 0;
        pGfxAdapterInfo->SkuTable.FtrLocalMemory           = 0;
        pGfxAdapterInfo->SkuTable.FtrDiscrete              = 0;
        pGfxAdapterInfo->SkuTable.FtrIA32eGfxPTEs          = 1;
        pGfxAdapterInfo->SkuTable.FtrL4Cache               = 1;
        pGfxAdapterInfo->SkuTable.FtrL3TransientDataFlush  = 0;

        if (platform == IGFX_BMG)
        {
            pGfxAdapterInfo->SkuTable.FtrLocalMemory = 1;
            pGfxAdapterInfo->SkuTable.FtrDiscrete    = 1;
        }

        if (platform >= IGFX_BMG)
        {
            pGfxAdapterInfo->SkuTable.FtrL3TransientDataFlush = 1;
	    pGfxAdapterInfo->WaTable.Wa_14018976079           = 1;
	    pGfxAdapterInfo->WaTable.Wa_14018984349           = 1;
	}

        CommonULT::SetUpTestCase();
    }
}